

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Cmd::nextLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Cmd *this,bool mask_mode)

{
  string_view str;
  size_t sVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined8 local_1060;
  size_t len;
  char buf [4096];
  string local_40;
  byte local_19;
  Cmd *pCStack_18;
  bool mask_mode_local;
  Cmd *this_local;
  
  local_19 = mask_mode;
  pCStack_18 = this;
  this_local = (Cmd *)__return_storage_ptr__;
  iVar3 = isatty(this->in_fd_);
  if (iVar3 == 0) {
    readlineNoTTY_abi_cxx11_(&local_40,this);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar2 = isUnsupportedTerm();
    if (bVar2) {
      str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      write_string(this,str);
      fflush((FILE *)this->out_);
      pcVar4 = fgets((char *)&len,0x1000,(FILE *)this->in_);
      if (pcVar4 == (char *)0x0) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional(__return_storage_ptr__);
      }
      else {
        local_1060 = strlen((char *)&len);
        while( true ) {
          sVar1 = local_1060;
          bVar2 = false;
          if ((local_1060 != 0) &&
             (bVar2 = true, *(char *)((long)&local_1060 + local_1060 + 7) != '\n')) {
            bVar2 = *(char *)((long)&local_1060 + local_1060 + 7) == '\r';
          }
          if (!bVar2) break;
          local_1060 = local_1060 - 1;
          *(undefined1 *)((long)&local_1060 + sVar1 + 7) = 0;
        }
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<char[4096],_true>(__return_storage_ptr__,(char (*) [4096])&len);
      }
    }
    else {
      readlineRaw_abi_cxx11_(__return_storage_ptr__,this,(bool)(local_19 & 1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> nextLine(bool mask_mode = false) {
		if (!isatty(in_fd_)) {
			// Not a tty: read from file / pipe.
			return readlineNoTTY();
		} else if (isUnsupportedTerm()) {

			write_string(prompt);
			fflush(out_);

			char buf[MaxLineLength];
			if (fgets(buf, sizeof(buf), in_) == nullptr) {
				return {};
			}

			size_t len = strlen(buf);
			while (len != 0 && (buf[len - 1] == '\n' || buf[len - 1] == '\r')) {
				buf[--len] = '\0';
			}

			return buf;
		} else {
			return readlineRaw(mask_mode);
		}
	}